

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O3

void __thiscall KmerCounter::read_counts(KmerCounter *this,ifstream *count_file)

{
  pointer pbVar1;
  pointer pvVar2;
  pointer puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pointer pbVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *v_1;
  pointer this_00;
  uint64_t count;
  uint64_t count_1;
  size_type local_40;
  size_type local_38;
  
  std::istream::read((char *)count_file,(long)&this->k);
  std::istream::read((char *)count_file,(long)&this->count_mode);
  std::istream::read((char *)count_file,(long)&local_40);
  std::__cxx11::string::resize((ulong)&this->name,(char)local_40);
  std::istream::read((char *)count_file,(long)(this->name)._M_dataplus._M_p);
  std::istream::read((char *)count_file,(long)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->count_names,local_38);
  pbVar4 = (this->count_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->count_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      std::istream::read((char *)count_file,(long)&local_40);
      std::__cxx11::string::resize((ulong)pbVar4,(char)local_40);
      std::istream::read((char *)count_file,(long)(pbVar4->_M_dataplus)._M_p);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  if (this->k < ' ') {
    std::istream::read((char *)count_file,(long)&local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->kindex,local_40);
    if (local_40 == 0) goto LAB_001995da;
    puVar3 = (pointer)(this->kindex).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
  }
  else {
    std::istream::read((char *)count_file,(long)&local_40);
    std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::resize
              (&this->kindex128,local_40);
    if (local_40 == 0) goto LAB_001995da;
    puVar3 = (this->kindex128).
             super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::istream::read((char *)count_file,(long)puVar3);
LAB_001995da:
  std::istream::read((char *)count_file,(long)&local_38);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::resize(&this->counts,local_38);
  if (local_38 != 0) {
    this_00 = (this->counts).
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->counts).
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pvVar2) {
      do {
        std::istream::read((char *)count_file,(long)&local_40);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(this_00,local_40);
        if (local_40 != 0) {
          std::istream::read((char *)count_file,
                             (long)(this_00->
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pvVar2);
    }
  }
  return;
}

Assistant:

void KmerCounter::read_counts(std::ifstream &count_file) {
    count_file.read((char *) &k, sizeof(k));
    count_file.read((char *) &count_mode, sizeof(count_mode));
    sdglib::read_string(count_file,name);
    sdglib::read_stringvector(count_file,count_names);
    if (k<=31) sdglib::read_flat_vector(count_file,kindex);
    else sdglib::read_flat_vector(count_file,kindex128);
    sdglib::read_flat_vectorvector(count_file,counts);
}